

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo6.cpp
# Opt level: O2

void no_intrin(state *s)

{
  pointer puVar1;
  int iVar2;
  uint32_t uVar3;
  rep rVar4;
  long lVar5;
  scope scope;
  int i;
  int iVar6;
  uint *elem;
  pointer puVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v;
  uint local_3c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (uint32_t *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (uint32_t *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  srand(s->_iterations);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,(long)s->_iterations);
  for (iVar6 = 0; iVar6 < s->_iterations; iVar6 = iVar6 + 1) {
    iVar2 = rand();
    local_3c = iVar2 + 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,&local_3c);
  }
  rVar4 = std::chrono::_V2::system_clock::now();
  puVar1 = local_38._M_impl.super__Vector_impl_data._M_finish;
  (s->_start).__d.__r = rVar4;
  iVar6 = 0;
  for (puVar7 = local_38._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1;
      puVar7 = puVar7 + 1) {
    uVar3 = lame_count_bits(*puVar7);
    iVar6 = iVar6 + uVar3;
  }
  lVar5 = std::chrono::_V2::system_clock::now();
  s->_duration_ns = lVar5 - (s->_start).__d.__r;
  s->_result = (long)iVar6;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void no_intrin(picobench::state& s)
{
    std::vector<uint32_t> v;
    srand(s.iterations());
    v.reserve(s.iterations());

    for (int i = 0; i<s.iterations(); ++i) {
        int n = rand() + 1;
        v.push_back(n);
    }

    int sum = 0;

    {
        picobench::scope scope(s);
        for (const auto& elem : v) {
            sum += lame_count_bits(elem);
        }
    }

    s.set_result(sum);
}